

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThriftSenderTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::anon_unknown_2::MockUDPSender::emitBatch(MockUDPSender *this,Batch *batch)

{
  system_error *this_00;
  exception *this_01;
  undefined8 *puVar1;
  error_code eVar2;
  error_code __ec;
  Batch *batch_local;
  MockUDPSender *this_local;
  
  if (this->_type == kSystemError) {
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    eVar2 = std::make_error_code(invalid_argument);
    __ec._M_cat = eVar2._M_cat;
    __ec._4_4_ = 0;
    __ec._M_value = eVar2._M_value;
    std::system_error::system_error(this_00,__ec);
    __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  if (this->_type != kException) {
    if (this->_type == kString) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = "error";
      __cxa_throw(puVar1,&char_const*::typeinfo,0);
    }
    __assert_fail("_type == ExceptionType::kString",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ThriftSenderTest.cpp"
                  ,0x31,
                  "virtual void jaegertracing::(anonymous namespace)::MockUDPSender::emitBatch(const thrift::Batch &)"
                 );
  }
  this_01 = (exception *)__cxa_allocate_exception(8);
  std::exception::exception(this_01);
  __cxa_throw(this_01,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void emitBatch(const thrift::Batch& batch) override
    {
        switch (_type) {
        case ExceptionType::kSystemError:
            throw std::system_error(
                std::make_error_code(std::errc::invalid_argument));
        case ExceptionType::kException:
            throw std::exception();
        default:
            assert(_type == ExceptionType::kString);
            throw "error";
        }
    }